

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O3

REF_STATUS ref_layer_create(REF_LAYER *ref_layer_ptr,REF_MPI ref_mpi)

{
  uint uVar1;
  REF_LAYER ref_list_ptr;
  undefined8 uVar2;
  char *pcVar3;
  
  ref_list_ptr = (REF_LAYER)malloc(0x18);
  *ref_layer_ptr = ref_list_ptr;
  if (ref_list_ptr == (REF_LAYER)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x2b,
           "ref_layer_create","malloc *ref_layer_ptr of REF_LAYER_STRUCT NULL");
    uVar1 = 2;
  }
  else {
    uVar1 = ref_list_create((REF_LIST *)ref_list_ptr);
    if (uVar1 == 0) {
      uVar1 = ref_grid_create(&ref_list_ptr->ref_grid,ref_mpi);
      if (uVar1 == 0) {
        ref_list_ptr->nnode_per_layer = -1;
        ref_list_ptr->verbose = 0;
        return 0;
      }
      pcVar3 = "create grid";
      uVar2 = 0x30;
    }
    else {
      pcVar3 = "create list";
      uVar2 = 0x2f;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar2,
           "ref_layer_create",(ulong)uVar1,pcVar3);
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_layer_create(REF_LAYER *ref_layer_ptr, REF_MPI ref_mpi) {
  REF_LAYER ref_layer;

  ref_malloc(*ref_layer_ptr, 1, REF_LAYER_STRUCT);

  ref_layer = *ref_layer_ptr;

  RSS(ref_list_create(&(ref_layer_list(ref_layer))), "create list");
  RSS(ref_grid_create(&(ref_layer_grid(ref_layer)), ref_mpi), "create grid");

  ref_layer->nnode_per_layer = REF_EMPTY;
  ref_layer->verbose = REF_FALSE;

  return REF_SUCCESS;
}